

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

size_t nni_url_decode(uint8_t *out,char *in,size_t max_len)

{
  uint8_t uVar1;
  ushort **ppuVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  size_t sVar6;
  
  uVar1 = *in;
  if (uVar1 == '\0') {
    sVar5 = 0;
  }
  else {
    sVar6 = 0;
    while (sVar5 = 0xffffffffffffffff, max_len != sVar6) {
      if (uVar1 == '%') {
        ppuVar2 = __ctype_b_loc();
        uVar1 = ((uint8_t *)in)[1];
        if ((*(byte *)((long)*ppuVar2 + (long)(char)uVar1 * 2 + 1) & 0x10) == 0) {
          return 0xffffffffffffffff;
        }
        if ((*(byte *)((long)*ppuVar2 + (long)(char)((uint8_t *)in)[2] * 2 + 1) & 0x10) == 0) {
          return 0xffffffffffffffff;
        }
        bVar3 = uVar1 - 0x30;
        if (9 < bVar3) {
          if ((byte)(uVar1 + 0xbf) < 6) {
            bVar3 = uVar1 - 0x37;
          }
          else {
            bVar3 = uVar1 + 0xa9;
            if (5 < (byte)(uVar1 + 0x9f)) {
              bVar3 = 0;
            }
          }
        }
        out[sVar6] = bVar3 * '\x10';
        uVar1 = ((uint8_t *)in)[2];
        bVar4 = uVar1 - 0x30;
        if (9 < bVar4) {
          if ((byte)(uVar1 + 0xbf) < 6) {
            bVar4 = uVar1 - 0x37;
          }
          else {
            bVar4 = uVar1 + 0xa9;
            if (5 < (byte)(uVar1 + 0x9f)) {
              bVar4 = 0;
            }
          }
        }
        in = (char *)((uint8_t *)in + 3);
        out[sVar6] = bVar4 + bVar3 * '\x10';
      }
      else {
        out[sVar6] = uVar1;
        in = (char *)((uint8_t *)in + 1);
      }
      sVar6 = sVar6 + 1;
      uVar1 = *in;
      if (uVar1 == '\0') {
        return sVar6;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t
nni_url_decode(uint8_t *out, const char *in, size_t max_len)
{
	size_t  len;
	uint8_t c;

	len = 0;
	while ((c = (uint8_t) *in) != '\0') {
		if (len >= max_len) {
			return ((size_t) -1);
		}
		if (c == '%') {
			in++;
			if ((!isxdigit(in[0])) || (!isxdigit(in[1]))) {
				return ((size_t) -1);
			}
			out[len] = url_hex_val(*in++);
			out[len] <<= 4u;
			out[len] += url_hex_val(*in++);
			len++;
		} else {
			out[len++] = c;
			in++;
		}
	}
	return (len);
}